

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.hpp
# Opt level: O0

Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
__thiscall
Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(QKbo *this,Literal *l)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  i;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  i_00;
  AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_> *pAVar1;
  MultiSet<Kernel::TermList> *this_00;
  Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *in_RDI;
  AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_> norm;
  Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *out;
  AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffdc8;
  AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffdd0;
  InequalityNormalizer *in_stack_fffffffffffffdd8;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:112:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:113:16),_Kernel::TermList>_>
  *in_stack_fffffffffffffde8;
  Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *pRVar2;
  undefined1 *puVar3;
  undefined1 local_1a8 [32];
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>_>
  local_188;
  IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:112:19),_false>_>
  local_158;
  uint64_t local_120;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *pPStack_108;
  undefined1 local_f0 [32];
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>_>
  local_d0;
  IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:109:21),_false>_>
  local_a0;
  EVP_PKEY_CTX *local_68;
  undefined1 local_5d;
  undefined1 local_50 [80];
  
  pRVar2 = in_RDI;
  QKbo::norm((QKbo *)0x94c2f9);
  puVar3 = local_50;
  InequalityNormalizer::normalize<Kernel::NumTraits<Kernel::RealConstantType>>
            (in_stack_fffffffffffffdd8,(Literal *)in_stack_fffffffffffffdd0);
  pAVar1 = Lib::OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
           unwrap((OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                   *)0x94c320);
  AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>::AlascaLiteral
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Lib::Option<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Option
            ((Option<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
             0x94c348);
  local_5d = 0;
  Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *)in_stack_fffffffffffffdd0);
  this_00 = Lib::
            Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            ::operator->((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x94c364);
  AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>::term
            ((AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x94c378);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::iterSummands
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_stack_fffffffffffffdd0);
  i._iter._inner._next = (unsigned_long)pRVar2;
  i._iter._func.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)in_RDI;
  i._iter._inner._from = (unsigned_long)puVar3;
  i._iter._inner._to = (unsigned_long)pAVar1;
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>>
            (i);
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>>
  ::
  filter<Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_1_>
            (&local_d0,local_f0);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::{lambda(auto:1)#1},false>>
  ::
  map<Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_2_>
            (&local_a0,&local_d0);
  local_68 = (EVP_PKEY_CTX *)
             NumTraits<Kernel::RealConstantType>::
             sum<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_1_,false>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_2_,Kernel::TermList>>>
                       ((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:109:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_QKbo_hpp:110:18),_Kernel::TermList>_>
                         *)in_stack_fffffffffffffde8);
  AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>::term
            ((AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x94c418);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::iterSummands(pPStack_108);
  i_00._iter._inner._next = (unsigned_long)pRVar2;
  i_00._iter._func.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)in_RDI
  ;
  i_00._iter._inner._from = (unsigned_long)puVar3;
  i_00._iter._inner._to = (unsigned_long)pAVar1;
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>>
            (i_00);
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>>
  ::
  filter<Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_3_>
            (&local_188,local_1a8);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::{lambda(auto:1)#3},false>>
  ::
  map<Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_4_>
            (&local_158,&local_188);
  local_120 = (uint64_t)
              NumTraits<Kernel::RealConstantType>::
              sum<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_3_,false>,Kernel::QKbo::nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_4_,Kernel::TermList>>>
                        (in_stack_fffffffffffffde8);
  MultiSet<Kernel::TermList>::init(this_00,local_68);
  return pRVar2;
}

Assistant:

Recycled<MultiSet<TermList>> nfEquality(Literal* l) const
  {
    ASS(l->isEquality())
    using Num = typename NumTraits::ConstantType;
    auto norm = this->norm().template normalize<NumTraits>(l).unwrap();
    Recycled<MultiSet<TermList>> out;
    out->init(
      NumTraits::sum(
          iterTraits(norm.term().iterSummands())
            .filter([](auto x) { return x.numeral >= Num(0);  })
            .map([](auto x) { return x.denormalize(); })),
      NumTraits::sum(iterTraits(norm.term().iterSummands())
          .filter([](auto x) { return x.numeral <= Num(0);  })
          .map([](auto x) { return (-x).denormalize(); })));
    return out;

  }